

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base32.cpp
# Opt level: O3

void __thiscall Base32_UInt128MaxArray_Test::TestBody(Base32_UInt128MaxArray_Test *this)

{
  base32 *this_00;
  char *message;
  uint128 in_stack_ffffffffffffffb8;
  internal local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  string local_28;
  
  local_28._M_dataplus._M_p._0_4_ = 0xffffffff;
  local_28._M_dataplus._M_p._4_4_ = 0xffffffff;
  local_28._M_string_length._0_4_ = 0xffffffff;
  local_28._M_string_length._4_4_ = 0xffffffff;
  this_00 = (base32 *)pstore::uint128::bytes_to_uint128((uint8_t *)&local_28);
  pstore::base32::convert<pstore::uint128>(&local_28,this_00,in_stack_ffffffffffffffb8);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[27]>
            (local_38,"convert (v)","\"7777777777777777777777777h\"",&local_28,
             (char (*) [27])"7777777777777777777777777h");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_28._M_dataplus._M_p._4_4_,local_28._M_dataplus._M_p._0_4_) !=
      &local_28.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_28._M_dataplus._M_p._4_4_,local_28._M_dataplus._M_p._0_4_),
                    local_28.field_2._M_allocated_capacity + 1);
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_base32.cpp"
               ,0x4c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
    if ((long *)CONCAT44(local_28._M_dataplus._M_p._4_4_,local_28._M_dataplus._M_p._0_4_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_28._M_dataplus._M_p._4_4_,local_28._M_dataplus._M_p._0_4_
                                    ) + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  return;
}

Assistant:

TEST (Base32, UInt128MaxArray) {
    using pstore::uint128;
    using pstore::base32::convert;
    uint128 v{std::array<std::uint8_t, 16>{{
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
    }}};
    EXPECT_EQ (convert (v), "7777777777777777777777777h");
}